

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *errors;
  int iVar1;
  CURLcode CVar2;
  OperationConfig *config;
  CURL *pCVar3;
  char *fmt;
  int fd [2];
  uint local_a0 [2];
  GlobalConfig local_98;
  
  local_98.first = (OperationConfig *)0x0;
  local_98.current = (OperationConfig *)0x0;
  local_98.libcurl = (char *)0x0;
  local_98.fail_early = false;
  local_98.styled_output = false;
  local_98._74_6_ = 0;
  local_98.trace_fopened = false;
  local_98._49_3_ = 0;
  local_98.tracetype = TRACE_NONE;
  local_98.tracetime = false;
  local_98._57_3_ = 0;
  local_98.progressmode = 0;
  local_98.trace_dump = (char *)0x0;
  local_98.trace_stream = (FILE *)0x0;
  local_98.errors = (FILE *)0x0;
  local_98.errors_fopened = false;
  local_98._25_7_ = 0;
  local_98.easy = (CURL *)0x0;
  local_98.showerror = 0;
  local_98.mute = false;
  local_98.noprogress = false;
  local_98.isatty = false;
  local_98._15_1_ = 0;
  local_98.last = (OperationConfig *)0x0;
  local_a0[0] = 0;
  local_a0[1] = 0;
  do {
    if ((2 < local_a0[0]) && (2 < local_a0[1])) {
      close(local_a0[0]);
      close(local_a0[1]);
      break;
    }
    iVar1 = pipe((int *)local_a0);
  } while (-1 < iVar1);
  signal(0xd,(__sighandler_t)0x1);
  errors = _stderr;
  local_98.showerror = -1;
  local_98.errors = (FILE *)_stderr;
  local_98.styled_output = true;
  config = (OperationConfig *)malloc(0x4a0);
  local_98.first = config;
  local_98.last = config;
  if (config == (OperationConfig *)0x0) {
    helpf((FILE *)errors,"error initializing curl\n");
LAB_0011352e:
    CVar2 = CURLE_FAILED_INIT;
  }
  else {
    CVar2 = curl_global_init(3);
    if (CVar2 == CURLE_OK) {
      CVar2 = get_libcurl_info();
      if (CVar2 == CURLE_OK) {
        pCVar3 = (CURL *)curl_easy_init();
        local_98.easy = pCVar3;
        if (pCVar3 != (CURL *)0x0) {
          config_init(config);
          config->easy = pCVar3;
          config->global = &local_98;
          CVar2 = operate(&local_98,argc,argv);
          curl_easy_cleanup(local_98.easy);
          local_98.easy = (CURL *)0x0;
          curl_global_cleanup();
          free(local_98.trace_dump);
          local_98.trace_dump = (char *)0x0;
          if ((local_98.errors_fopened == true) && ((FILE *)local_98.errors != (FILE *)0x0)) {
            fclose((FILE *)local_98.errors);
          }
          local_98.errors = (FILE *)0x0;
          if ((local_98.trace_fopened == true) && ((FILE *)local_98.trace_stream != (FILE *)0x0)) {
            fclose((FILE *)local_98.trace_stream);
          }
          local_98.trace_stream = (FILE *)0x0;
          free(local_98.libcurl);
          local_98.libcurl = (char *)0x0;
          config_free(local_98.last);
          return CVar2;
        }
        helpf((FILE *)_stderr,"error initializing curl easy handle\n");
        free(config);
        goto LAB_0011352e;
      }
      fmt = "error retrieving curl library information\n";
    }
    else {
      fmt = "error initializing curl library\n";
    }
    helpf((FILE *)_stderr,fmt);
    free(config);
  }
  return CVar2;
}

Assistant:

int main(int argc, char *argv[])
{
  CURLcode result = CURLE_OK;
  struct GlobalConfig global;
  memset(&global, 0, sizeof(global));

  /* Perform any platform-specific terminal configuration */
  configure_terminal();

  main_checkfds();

#if defined(HAVE_SIGNAL) && defined(SIGPIPE)
  (void)signal(SIGPIPE, SIG_IGN);
#endif

  /* Initialize memory tracking */
  memory_tracking_init();

  /* Initialize the curl library - do not call any libcurl functions before
     this point */
  result = main_init(&global);

#ifdef WIN32
  /* Undocumented diagnostic option to list the full paths of all loaded
     modules, regardless of whether or not initialization succeeded. */
  if(argc == 2 && !strcmp(argv[1], "--dump-module-paths")) {
    struct curl_slist *item, *head = GetLoadedModulePaths();
    for(item = head; item; item = item->next) {
      printf("%s\n", item->data);
    }
    curl_slist_free_all(head);
    if(!result)
      main_free(&global);
  }
  else
#endif /* WIN32 */
  if(!result) {
    /* Start our curl operation */
    result = operate(&global, argc, argv);

#ifdef __SYMBIAN32__
    if(global.showerror)
      tool_pressanykey();
#endif

    /* Perform the main cleanup */
    main_free(&global);
  }

  /* Return the terminal to its original state */
  restore_terminal();

#ifdef __NOVELL_LIBC__
  if(getenv("_IN_NETWARE_BASH_") == NULL)
    tool_pressanykey();
#endif

#ifdef __VMS
  vms_special_exit(result, vms_show);
#else
  return (int)result;
#endif
}